

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O2

void __thiscall ConfigurationTest::SetUp(ConfigurationTest *this)

{
  char cVar1;
  long lVar2;
  runtime_error *this_00;
  string *__rhs;
  string sStack_238;
  ofstream of;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  std::__cxx11::to_string(&sStack_238,lVar2 / 1000);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&of,
                 "ConfigurationTest.",&sStack_238);
  __rhs = &this->filename;
  std::__cxx11::string::operator=((string *)__rhs,(string *)&of);
  std::__cxx11::string::~string((string *)&of);
  std::__cxx11::string::~string((string *)&sStack_238);
  std::ofstream::ofstream(&of,(string *)__rhs,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::operator<<((ostream *)&of,(string *)(anonymous_namespace)::propertyFileContent_abi_cxx11_);
    std::ofstream::close();
    setenv("AERON_ARCHIVE_MESSAGE_TIMEOUT","123456",1);
    setenv("AERON_ARCHIVE_CONTROL_CHANNEL","qqqwwweee",1);
    setenv("AERON_ARCHIVE_CONTROL_STREAM_ID","42",1);
    setenv("AERON_ARCHIVE_LOCAL_CONTROL_CHANNEL","ipc:aeron",1);
    setenv("AERON_ARCHIVE_LOCAL_CONTROL_STREAM_ID","314",1);
    setenv("AERON_ARCHIVE_CONTROL_RESPONSE_CHANNEL","ResponsEconTrol",1);
    setenv("AERON_ARCHIVE_CONTROL_RESPONSE_STREAM_ID","271",1);
    setenv("AERON_ARCHIVE_RECORDING_EVENTS_CHANNEL","aaaaassss",1);
    setenv("AERON_ARCHIVE_RECORDING_EVENTS_STREAM_ID","144",1);
    setenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_SPARSE","0",1);
    setenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_LENGTH","1024",1);
    setenv("AERON_ARCHIVE_CONTROL_MTU_LENGTH","1812",1);
    std::ofstream::~ofstream(&of);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&sStack_238,"Can\'t create a temporary file: ",__rhs);
  std::runtime_error::runtime_error(this_00,(string *)&sStack_238);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SetUp() override {
        using namespace std::chrono;

        // generate an almost unique filename
        std::uint64_t ts = duration_cast<microseconds>(high_resolution_clock::now().time_since_epoch()).count();
        filename = "ConfigurationTest." + std::to_string(ts);

        std::ofstream of(filename);
        if (!of.is_open()) {
            throw std::runtime_error("Can't create a temporary file: " + filename);
        }

        of << propertyFileContent;
        of.close();

        // set env variables
        setenv("AERON_ARCHIVE_MESSAGE_TIMEOUT", "123456", 1);
        setenv("AERON_ARCHIVE_CONTROL_CHANNEL", "qqqwwweee", 1);
        setenv("AERON_ARCHIVE_CONTROL_STREAM_ID", "42", 1);
        setenv("AERON_ARCHIVE_LOCAL_CONTROL_CHANNEL", "ipc:aeron", 1);
        setenv("AERON_ARCHIVE_LOCAL_CONTROL_STREAM_ID", "314", 1);
        setenv("AERON_ARCHIVE_CONTROL_RESPONSE_CHANNEL", "ResponsEconTrol", 1);
        setenv("AERON_ARCHIVE_CONTROL_RESPONSE_STREAM_ID", "271", 1);
        setenv("AERON_ARCHIVE_RECORDING_EVENTS_CHANNEL", "aaaaassss", 1);
        setenv("AERON_ARCHIVE_RECORDING_EVENTS_STREAM_ID", "144", 1);
        setenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_SPARSE", "0", 1);
        setenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_LENGTH", "1024", 1);
        setenv("AERON_ARCHIVE_CONTROL_MTU_LENGTH", "1812", 1);
    }